

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O1

bool libwebm::Webm2Pes::WritePesPacket(VideoFrame *frame,PacketDataBuffer *packet_data)

{
  _Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> frame_00;
  pointer puVar1;
  uint8_t uVar2;
  VideoFrame *pVVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  Range *pRVar8;
  size_t sVar9;
  uint8_t *raw_input;
  size_t raw_input_length;
  bool error;
  Ranges frame_ranges;
  PesHeader header;
  BCMVHeader local_1a0;
  Ranges local_198;
  VideoFrame *local_178;
  Range *local_170;
  Range *local_168;
  PesHeader local_160;
  
  frame_00.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (frame->buffer_).data._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>;
  if ((frame_00.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl == (uchar *)0x0) ||
     (sVar9 = (frame->buffer_).length, sVar9 == 0)) {
    return false;
  }
  local_198.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
  super__Vector_impl_data._M_start = (Range *)0x0;
  local_198.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
  super__Vector_impl_data._M_finish = (Range *)0x0;
  local_198.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Range *)0x0;
  if (frame->codec_ == kVP9) {
    local_1a0.bcmv = (uint8_t  [4])((uint)local_1a0.bcmv & 0xffffff00);
    bVar4 = ParseVP9SuperFrameIndex
                      ((uint8_t *)
                       frame_00.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,sVar9,
                       &local_198,(bool *)&local_1a0);
    uVar2 = local_1a0.bcmv[0];
    if (local_1a0.bcmv[0] == '\x01') {
      WritePesPacket();
    }
    else if (!bVar4) {
      local_160.optional_header.marker.bits = (frame->buffer_).length;
      local_160.start_code[0] = '\0';
      local_160.start_code[1] = '\0';
      local_160.start_code[2] = '\0';
      local_160.start_code[3] = '\0';
      local_160.packet_length = 0;
      local_160._6_2_ = 0;
      if (local_198.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_198.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::
        _M_realloc_insert<libwebm::Range>
                  (&local_198,
                   (iterator)
                   local_198.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(Range *)&local_160);
      }
      else {
        (local_198.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
         super__Vector_impl_data._M_finish)->offset = 0;
        (local_198.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
         super__Vector_impl_data._M_finish)->length = local_160.optional_header.marker.bits;
        local_198.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_198.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    if (uVar2 != '\0') {
      bVar4 = false;
      goto LAB_0010e0fe;
    }
  }
  else {
    local_160.start_code[0] = '\0';
    local_160.start_code[1] = '\0';
    local_160.start_code[2] = '\0';
    local_160.start_code[3] = '\0';
    local_160.packet_length = 0;
    local_160._6_2_ = 0;
    local_160.optional_header.marker.bits = sVar9;
    std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::_M_realloc_insert<libwebm::Range>
              (&local_198,(iterator)0x0,(Range *)&local_160);
  }
  uVar6 = NanosecondsTo90KhzTicks(frame->nanosecond_pts_);
  local_160._0_6_ = 0xe0010000;
  local_160.optional_header.marker.bits = 2;
  local_160.optional_header.marker.num_bits = 2;
  local_160.optional_header.marker.index = '\0';
  local_160.optional_header.marker.shift = 6;
  local_160.optional_header.scrambling.bits = 0;
  local_160.optional_header.scrambling.num_bits = 2;
  local_160.optional_header.scrambling.index = '\0';
  local_160.optional_header.scrambling.shift = 4;
  local_160.optional_header.priority.bits = 0;
  local_160.optional_header.priority.num_bits = 1;
  local_160.optional_header.priority.index = '\0';
  local_160.optional_header.priority.shift = 3;
  local_160.optional_header.data_alignment.bits = 0;
  local_160.optional_header.data_alignment.num_bits = 1;
  local_160.optional_header.data_alignment.index = '\0';
  local_160.optional_header.data_alignment.shift = 2;
  local_160.optional_header.copyright.bits = 0;
  local_160.optional_header.copyright.num_bits = 1;
  local_160.optional_header.copyright.index = '\0';
  local_160.optional_header.copyright.shift = 1;
  local_160.optional_header.original.bits = 0;
  local_160.optional_header.original.num_bits = 1;
  local_160.optional_header.original.index = '\0';
  local_160.optional_header.original.shift = 0;
  local_160.optional_header.has_pts.bits = 1;
  local_160.optional_header.has_pts.num_bits = 1;
  local_160.optional_header.has_pts.index = '\x01';
  local_160.optional_header.has_pts.shift = 7;
  local_160.optional_header.has_dts.bits = 0;
  local_160.optional_header.has_dts.num_bits = 1;
  local_160.optional_header.has_dts.index = '\x01';
  local_160.optional_header.has_dts.shift = 6;
  local_160.optional_header.unused.bits = 0;
  local_160.optional_header.unused.num_bits = 6;
  local_160.optional_header.unused.index = '\x01';
  local_160.optional_header.unused.shift = 0;
  local_160.optional_header.remaining_size.bits = 6;
  local_160.optional_header.remaining_size.num_bits = 8;
  local_160.optional_header.remaining_size.index = '\x02';
  local_160.optional_header.remaining_size.shift = 0;
  local_160.optional_header.pts.num_bits = 0x28;
  local_160.optional_header.pts.index = '\x03';
  local_160.optional_header.pts.shift = 0;
  local_160.optional_header.stuffing_byte.bits = 0xff;
  local_160.optional_header.stuffing_byte.num_bits = 8;
  local_160.optional_header.stuffing_byte.index = '\b';
  local_160.optional_header.stuffing_byte.shift = 0;
  local_160.optional_header.fragment = false;
  local_160.optional_header.pts.bits =
       (ulong)(CONCAT14((char)uVar6 * '\x02',
                        CONCAT13((char)(uVar6 >> 7),
                                 CONCAT12((char)(uVar6 >> 0xe),
                                          CONCAT11((char)(uVar6 >> 0x16),(char)(uVar6 >> 0x1d))))) &
               0xffffffff0e | 0x10021) | 0x100000000;
  puVar1 = (packet_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((packet_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (packet_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  local_170 = local_198.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
              super__Vector_impl_data._M_finish;
  bVar4 = local_198.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_198.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
          super__Vector_impl_data._M_finish;
  pRVar8 = local_198.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3 = frame;
  if (!bVar4) {
    while( true ) {
      local_178 = pVVar3;
      pVVar3 = local_178;
      uVar6 = pRVar8->length;
      uVar7 = uVar6 - 0x8000;
      if (uVar6 < 0x8000) {
        uVar7 = 0;
      }
      if ((local_178->buffer_).length < pRVar8->offset + uVar6) break;
      local_160.packet_length = ((short)uVar6 - (short)uVar7) + 10;
      bVar5 = PesHeader::Write(&local_160,true,packet_data);
      if (!bVar5) {
        WritePesPacket();
        goto LAB_0010e0fe;
      }
      local_1a0.length = (uint32_t)pRVar8->length;
      builtin_memcpy(local_1a0.bcmv,"BCMV",4);
      bVar5 = BCMVHeader::Write(&local_1a0,packet_data);
      if (!bVar5) {
        WritePesPacket();
        goto LAB_0010e0fe;
      }
      raw_input = (uint8_t *)
                  ((long)(pVVar3->buffer_).data._M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false> + pRVar8->offset);
      sVar9 = pRVar8->length - uVar7;
      local_168 = pRVar8;
      bVar5 = CopyAndEscapeStartCodes(raw_input,sVar9,packet_data);
      if (!bVar5) {
        WritePesPacket();
        goto LAB_0010e0fe;
      }
      while (uVar7 != 0) {
        raw_input_length = 0x8000;
        if (uVar7 < 0x8000) {
          raw_input_length = uVar7;
        }
        local_160.packet_length = (uint16_t)raw_input_length;
        bVar5 = PesHeader::Write(&local_160,false,packet_data);
        if (bVar5) {
          bVar5 = CopyAndEscapeStartCodes(raw_input + sVar9,raw_input_length,packet_data);
          if (bVar5) {
            sVar9 = sVar9 + raw_input_length;
          }
          else {
            WritePesPacket();
          }
        }
        else {
          WritePesPacket();
          bVar5 = false;
        }
        uVar7 = uVar7 - raw_input_length;
        if (bVar5 == false) goto LAB_0010e0fe;
      }
      bVar4 = local_168 + 1 == local_170;
      pRVar8 = local_168 + 1;
      pVVar3 = local_178;
      if (bVar4) goto LAB_0010e0fe;
    }
    WritePesPacket();
  }
LAB_0010e0fe:
  if (local_198.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
      super__Vector_impl_data._M_start != (Range *)0x0) {
    operator_delete(local_198.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool Webm2Pes::WritePesPacket(const VideoFrame& frame,
                              PacketDataBuffer* packet_data) {
  if (frame.buffer().data.get() == nullptr || frame.buffer().length < 1)
    return false;

  Ranges frame_ranges;
  if (frame.codec() == VideoFrame::kVP9) {
    bool error = false;
    const bool has_superframe_index =
        ParseVP9SuperFrameIndex(frame.buffer().data.get(),
                                frame.buffer().length, &frame_ranges, &error);
    if (error) {
      std::fprintf(stderr, "Webm2Pes: Superframe index parse failed.\n");
      return false;
    }
    if (has_superframe_index == false) {
      frame_ranges.push_back(Range(0, frame.buffer().length));
    }
  } else {
    frame_ranges.push_back(Range(0, frame.buffer().length));
  }

  const std::int64_t khz90_pts =
      NanosecondsTo90KhzTicks(frame.nanosecond_pts());
  PesHeader header;
  header.optional_header.SetPtsBits(khz90_pts);

  packet_data->clear();

  for (const Range& packet_payload_range : frame_ranges) {
    std::size_t extra_bytes = 0;
    if (packet_payload_range.length > kMaxPayloadSize) {
      extra_bytes = packet_payload_range.length - kMaxPayloadSize;
    }
    if (packet_payload_range.length + packet_payload_range.offset >
        frame.buffer().length) {
      std::fprintf(stderr, "Webm2Pes: Invalid frame length.\n");
      return false;
    }

    // First packet of new frame. Always include PTS and BCMV header.
    header.packet_length =
        packet_payload_range.length - extra_bytes + BCMVHeader::size();
    if (header.Write(true, packet_data) != true) {
      std::fprintf(stderr, "Webm2Pes: packet header write failed.\n");
      return false;
    }

    BCMVHeader bcmv_header(static_cast<uint32_t>(packet_payload_range.length));
    if (bcmv_header.Write(packet_data) != true) {
      std::fprintf(stderr, "Webm2Pes: BCMV write failed.\n");
      return false;
    }

    // Insert the payload at the end of |packet_data|.
    const std::uint8_t* const payload_start =
        frame.buffer().data.get() + packet_payload_range.offset;

    const std::size_t bytes_to_copy = packet_payload_range.length - extra_bytes;
    if (CopyAndEscapeStartCodes(payload_start, bytes_to_copy, packet_data) ==
        false) {
      fprintf(stderr, "Webm2Pes: Payload write failed.\n");
      return false;
    }

    std::size_t bytes_copied = bytes_to_copy;
    while (extra_bytes) {
      // Write PES packets for the remaining data, but omit the PTS and BCMV
      // header.
      const std::size_t extra_bytes_to_copy =
          std::min(kMaxPayloadSize, extra_bytes);
      extra_bytes -= extra_bytes_to_copy;
      header.packet_length = extra_bytes_to_copy;
      if (header.Write(false, packet_data) != true) {
        fprintf(stderr, "Webm2pes: fragment write failed.\n");
        return false;
      }

      const std::uint8_t* fragment_start = payload_start + bytes_copied;
      if (CopyAndEscapeStartCodes(fragment_start, extra_bytes_to_copy,
                                  packet_data) == false) {
        fprintf(stderr, "Webm2Pes: Payload write failed.\n");
        return false;
      }

      bytes_copied += extra_bytes_to_copy;
    }
  }

  return true;
}